

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O3

String * __thiscall
kj::_::concat<kj::CappedArray<char,14ul>,kj::StringPtr&,kj::CappedArray<char,5ul>>
          (String *__return_storage_ptr__,_ *this,CappedArray<char,_14UL> *params,
          StringPtr *params_1,CappedArray<char,_5UL> *params_2)

{
  size_t __n;
  void *__src;
  long lVar1;
  char *__n_00;
  char *__dest;
  
  heapString(__return_storage_ptr__,
             (size_t)((params_1->content).ptr + *(long *)params->content + *(long *)this + -1));
  __dest = (char *)(__return_storage_ptr__->content).size_;
  if (__dest != (char *)0x0) {
    __dest = (__return_storage_ptr__->content).ptr;
  }
  __n = *(size_t *)this;
  if (__n != 0) {
    memcpy(__dest,this + 8,__n);
    __dest = __dest + __n;
  }
  __src = (void *)params->currentSize;
  lVar1 = *(long *)params->content;
  if (__src != (void *)((long)__src + lVar1 + -1)) {
    memcpy(__dest,__src,lVar1 - 1);
    __dest = __dest + lVar1 + -1;
  }
  __n_00 = (params_1->content).ptr;
  if (__n_00 != (char *)0x0) {
    memcpy(__dest,&(params_1->content).size_,(size_t)__n_00);
  }
  return __return_storage_ptr__;
}

Assistant:

String concat(Params&&... params) {
  // Concatenate a bunch of containers into a single Array.  The containers can be anything that
  // is iterable and whose elements can be converted to `char`.

  String result = heapString(sum({params.size()...}));
  fill(result.begin(), kj::fwd<Params>(params)...);
  return result;
}